

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kmp_wait_release.h
# Opt level: O2

__pid_t __thiscall kmp_flag_64::wait(kmp_flag_64 *this,void *__stat_loc)

{
  kmp_int32 gtid;
  int iVar1;
  unsigned_long_long *puVar2;
  int iVar3;
  int iVar4;
  __pid_t _Var5;
  long lVar6;
  ulong uVar7;
  undefined1 *puVar8;
  void *in_RCX;
  int in_EDX;
  kmp_uint32 kVar9;
  int iVar10;
  int tasks_completed;
  void *local_40;
  ulong local_38;
  
  kVar9 = __kmp_yield_init;
  puVar2 = (this->super_kmp_basic_flag<unsigned_long_long>).super_kmp_flag<unsigned_long_long>.loc;
  tasks_completed = 0;
  if (*(this->super_kmp_basic_flag<unsigned_long_long>).super_kmp_flag<unsigned_long_long>.loc ==
      (this->super_kmp_basic_flag<unsigned_long_long>).checker) {
    puVar8 = __kmp_itt_fsync_acquired_ptr__3_0;
    if (__kmp_itt_fsync_acquired_ptr__3_0 != (undefined1 *)0x0 && __kmp_itt_prepare_delay < 1) {
      _Var5 = (*(code *)__kmp_itt_fsync_acquired_ptr__3_0)(puVar2);
      return _Var5;
    }
  }
  else {
    gtid = *(kmp_int32 *)((long)__stat_loc + 0x24);
    local_40 = in_RCX;
    if (__kmp_dflt_blocktime != 0x7fffffff) {
      lVar6 = __kmp_hardware_timestamp();
      local_38 = lVar6 + *(long *)((long)__stat_loc + 0x88);
    }
    iVar4 = __kmp_nth;
    iVar3 = __kmp_avail_proc;
    iVar10 = 0;
LAB_0013d031:
    if (*(this->super_kmp_basic_flag<unsigned_long_long>).super_kmp_flag<unsigned_long_long>.loc !=
        (this->super_kmp_basic_flag<unsigned_long_long>).checker) {
      if (__kmp_tasking_mode == tskm_immediate_exec) {
LAB_0013d09b:
        lVar6 = 0;
      }
      else {
        lVar6 = *(long *)((long)__stat_loc + 0x170);
        if (lVar6 == 0) {
          *(undefined4 *)((long)__stat_loc + 0x198) = 1;
          goto LAB_0013d09b;
        }
        if (*(int *)(lVar6 + 0xc0) == 0) {
          *(undefined8 *)((long)__stat_loc + 0x170) = 0;
LAB_0013d0a9:
          *(undefined4 *)((long)__stat_loc + 0x198) = 1;
        }
        else {
          if (*(int *)(lVar6 + 0x50) != 1) goto LAB_0013d0a9;
          __kmp_execute_tasks_64
                    ((kmp_info_t *)__stat_loc,gtid,this,in_EDX,&tasks_completed,local_40,0);
        }
      }
      if (__kmp_itt_fsync_prepare_ptr__3_0 != (undefined1 *)0x0) {
        if (iVar10 < __kmp_itt_prepare_delay) {
          iVar10 = iVar10 + 1;
          if (__kmp_itt_prepare_delay <= iVar10) {
            (*(code *)__kmp_itt_fsync_prepare_ptr__3_0)(puVar2);
          }
        }
      }
      if (__kmp_global.g.g_done == 0) goto code_r0x0013d0f4;
      goto LAB_0013d1d3;
    }
LAB_0013d1e5:
    puVar8 = __kmp_itt_fsync_acquired_ptr__3_0;
    if (__kmp_itt_fsync_acquired_ptr__3_0 != (undefined1 *)0x0 && __kmp_itt_prepare_delay <= iVar10)
    {
      puVar8 = (undefined1 *)(*(code *)__kmp_itt_fsync_acquired_ptr__3_0)(puVar2);
    }
  }
  return (__pid_t)puVar8;
code_r0x0013d0f4:
  if (iVar3 < iVar4) {
    __kmp_yield(1);
  }
  else {
    kVar9 = kVar9 - 2;
    if (kVar9 == 0) {
      __kmp_yield(1);
      kVar9 = __kmp_yield_next;
    }
  }
  iVar1 = *(int *)((long)__stat_loc + 0x60);
  if ((*(char *)((long)__stat_loc + 0x19c) == '\0') == (iVar1 != 0)) {
    if (iVar1 == 0) {
      LOCK();
      __kmp_thread_pool_active_nth = __kmp_thread_pool_active_nth + -1;
      UNLOCK();
    }
    else {
      LOCK();
      __kmp_thread_pool_active_nth = __kmp_thread_pool_active_nth + 1;
      UNLOCK();
    }
    *(bool *)((long)__stat_loc + 0x19c) = iVar1 != 0;
  }
  if ((__kmp_dflt_blocktime != 0x7fffffff) && ((lVar6 == 0 || (*(int *)(lVar6 + 0x50) == 0)))) {
    uVar7 = __kmp_hardware_timestamp();
    if (local_38 <= uVar7) {
      __kmp_suspend_64(gtid,this);
      if (__kmp_global.g.g_done != 0) {
LAB_0013d1d3:
        if (__kmp_global.g.g_abort != 0) {
          __kmp_abort_thread();
        }
        goto LAB_0013d1e5;
      }
      if ((__kmp_tasking_mode != tskm_immediate_exec) && (*(int *)((long)__stat_loc + 0x198) == 1))
      {
        *(undefined4 *)((long)__stat_loc + 0x198) = 0;
      }
    }
  }
  goto LAB_0013d031;
}

Assistant:

void wait(kmp_info_t *this_thr,
            int final_spin USE_ITT_BUILD_ARG(void *itt_sync_obj)) {
    __kmp_wait_template(this_thr, this,
                        final_spin USE_ITT_BUILD_ARG(itt_sync_obj));
  }